

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

bool __thiscall absl::lts_20250127::Cord::EndsWith(Cord *this,Cord *rhs)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  size_t size_to_compare;
  size_t sVar4;
  Cord tmp;
  anon_union_16_2_39e9c77e_for_Rep_0 local_38;
  
  bVar1 = (this->contents_).data_.rep_.field_0.data[0];
  if (((long)(char)bVar1 & 1U) == 0) {
    sVar4 = (ulong)(long)(char)bVar1 >> 1;
  }
  else {
    sVar4 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  uVar3 = (ulong)(rhs->contents_).data_.rep_.field_0.data[0];
  if ((uVar3 & 1) == 0) {
    size_to_compare = uVar3 >> 1;
  }
  else {
    size_to_compare = ((rhs->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (sVar4 < size_to_compare) {
    bVar2 = false;
  }
  else {
    local_38.as_tree.rep = (this->contents_).data_.rep_.field_0.as_tree.rep;
    if (local_38.as_tree.rep == (CordRep *)0x0 || (bVar1 & 1) == 0) {
      local_38.as_tree.cordz_info = (this->contents_).data_.rep_.field_0.as_tree.cordz_info;
      local_38.as_tree.rep = (this->contents_).data_.rep_.field_0.as_tree.rep;
    }
    else {
      LOCK();
      ((local_38.as_tree.rep)->refcount).count_.super___atomic_base<int>._M_i =
           ((local_38.as_tree.rep)->refcount).count_.super___atomic_base<int>._M_i + 2;
      UNLOCK();
      local_38.as_tree.cordz_info = 1;
      bVar2 = cord_internal::InlineData::is_either_profiled
                        ((InlineData *)&local_38.as_tree,(InlineData *)this);
      if (bVar2) {
        cord_internal::CordzInfo::MaybeTrackCordImpl
                  ((InlineData *)&local_38.as_tree,(InlineData *)this,kConstructorCord);
      }
    }
    RemovePrefix((Cord *)&local_38.as_tree,sVar4 - size_to_compare);
    bVar2 = GenericCompare<bool,absl::lts_20250127::Cord>
                      ((Cord *)&local_38.as_tree,rhs,size_to_compare);
    ~Cord((Cord *)&local_38.as_tree);
  }
  return bVar2;
}

Assistant:

bool Cord::EndsWith(const Cord& rhs) const {
  size_t my_size = size();
  size_t rhs_size = rhs.size();

  if (my_size < rhs_size) return false;

  Cord tmp(*this);
  tmp.RemovePrefix(my_size - rhs_size);
  return tmp.EqualsImpl(rhs, rhs_size);
}